

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

bool __thiscall idx2::path::operator==(path *this,path *Other)

{
  bool bVar1;
  int local_24;
  int I;
  path *Other_local;
  path *this_local;
  
  if (this->NParts == Other->NParts) {
    for (local_24 = 0; local_24 < this->NParts; local_24 = local_24 + 1) {
      bVar1 = operator!=(this->Parts + local_24,Other->Parts + local_24);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
path::operator==(const path& Other) const
{
  if (this->NParts != Other.NParts)
    return false;
  for (int I = 0; I < this->NParts; ++I)
  {
    if (this->Parts[I] != Other.Parts[I])
      return false;
  }
  return true;
}